

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug __thiscall
QtPrivate::printAssociativeContainer<QHash<QNetworkRequest::KnownHeaders,QVariant>>
          (QtPrivate *this,QDebug debug,char *which,
          QHash<QNetworkRequest::KnownHeaders,_QVariant> *c)

{
  char *pcVar1;
  QDebug this_00;
  ulong uVar2;
  storage_type *psVar3;
  ulong uVar4;
  storage_type *psVar5;
  QTextStream *pQVar6;
  Data *pDVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QDebugStateSaver saver;
  QDebug local_70;
  QDebug local_68;
  QTextStream *local_60;
  undefined1 *local_58;
  QDebug local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar6 = *(QTextStream **)debug.stream;
  pQVar6[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar5 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      psVar5 = psVar3 + 1;
      pcVar1 = which + 1 + (long)psVar3;
      psVar3 = psVar5;
    } while (*pcVar1 != '\0');
  }
  QVar8.m_data = psVar5;
  QVar8.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar6,(QString *)local_50);
  if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
    UNLOCK();
    if (*(int *)local_50[0].stream == 0) {
      QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
    }
  }
  pQVar6 = *(QTextStream **)debug.stream;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)debug.stream;
  }
  QVar9.m_data = (storage_type *)0x1;
  QVar9.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar6,(QString *)local_50);
  if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
    UNLOCK();
    if (*(int *)local_50[0].stream == 0) {
      QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pDVar7 = c->d;
  if (pDVar7 == (Data *)0x0) {
    pDVar7 = (Data *)0x0;
    uVar4 = 0;
LAB_001fd92d:
    if (uVar4 == 0 && pDVar7 == (Data *)0x0) goto LAB_001fdaee;
  }
  else {
    if (pDVar7->spans->offsets[0] == 0xff) {
      uVar2 = 1;
      do {
        uVar4 = uVar2;
        if (pDVar7->numBuckets == uVar4) {
          pDVar7 = (Data *)0x0;
          uVar4 = 0;
          break;
        }
        uVar2 = uVar4 + 1;
      } while (pDVar7->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
      goto LAB_001fd92d;
    }
    uVar4 = 0;
  }
  do {
    QTextStream::operator<<(*(QTextStream **)debug.stream,'(');
    pQVar6 = *(QTextStream **)debug.stream;
    if (pQVar6[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar6,' ');
      pQVar6 = *(QTextStream **)debug.stream;
    }
    *(int *)(pQVar6 + 0x28) = *(int *)(pQVar6 + 0x28) + 1;
    local_70.stream = (Stream *)pQVar6;
    qt_QMetaEnum_debugOperator
              (&local_68,(longlong)&local_70,
               (QMetaObject *)
               (ulong)*(uint *)pDVar7->spans[uVar4 >> 7].entries
                               [pDVar7->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f]].storage.data,
               (char *)&QNetworkRequest::staticMetaObject);
    this_00.stream = local_68.stream;
    QVar10.m_data = (storage_type *)0x2;
    QVar10.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_68.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    local_50[0].stream = local_68.stream;
    *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
    QVariant::qdebugHelper((Stream *)&local_60);
    QDebug::~QDebug(local_50);
    QTextStream::operator<<(local_60,')');
    if (local_60[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_60,' ');
    }
    QDebug::~QDebug((QDebug *)&local_60);
    QDebug::~QDebug(&local_68);
    QDebug::~QDebug(&local_70);
    do {
      if (pDVar7->numBuckets - 1 == uVar4) {
        uVar4 = 0;
        pDVar7 = (Data *)0x0;
        break;
      }
      uVar4 = uVar4 + 1;
    } while (pDVar7->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
  } while (uVar4 != 0 || pDVar7 != (Data *)0x0);
LAB_001fdaee:
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  pQVar6 = *(QTextStream **)debug.stream;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)debug.stream;
  }
  *(undefined8 *)debug.stream = 0;
  *(QTextStream **)this = pQVar6;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}